

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *lhs;
  uint uVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar2;
  float *pfVar3;
  row_vec *prVar4;
  float *pfVar5;
  long lVar6;
  uint i_2;
  uint i;
  ulong uVar7;
  long lVar8;
  uint iter;
  int iVar9;
  float val;
  double dVar10;
  double dVar11;
  vec<2U,_float> axis;
  double local_90;
  double local_88;
  vec<2U,_float> x_2;
  vec<2U,_float> local_78;
  vec<2U,_float> delta_axis;
  vec<2U,_float> prev_axis;
  matrix<2U,_2U,_float> covar;
  
  if ((parent_node->m_vectors).m_size == 2) {
    vec<2U,_float>::operator=
              (left_child_res,&(this->m_training_vecs).m_p[*(parent_node->m_vectors).m_p].first);
    vec<2U,_float>::operator=
              (right_child_res,&(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[1]].first);
    return;
  }
  matrix<2U,_2U,_float>::clear(&covar);
  for (uVar7 = 0; uVar7 < (parent_node->m_vectors).m_size; uVar7 = uVar7 + 1) {
    operator-(&(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[uVar7]].first,
              &parent_node->m_centroid);
    operator*(&axis,(float)(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[uVar7]].second);
    lVar6 = 0;
    pfVar3 = prev_axis.m_s;
    pfVar5 = (float *)&covar;
    for (; lVar6 != 2; lVar6 = lVar6 + 1) {
      for (lVar8 = 0; lVar6 + lVar8 != 2; lVar8 = lVar8 + 1) {
        pfVar5[lVar8] = axis.m_s[lVar6] * pfVar3[lVar8] + pfVar5[lVar8];
      }
      pfVar5 = pfVar5 + 3;
      pfVar3 = pfVar3 + 1;
    }
  }
  uVar7 = parent_node->m_total_weight;
  pfVar3 = (float *)&covar;
  for (lVar6 = 0; lVar8 = -2, lVar6 != 2; lVar6 = lVar6 + 1) {
    for (; lVar6 + lVar8 != 0; lVar8 = lVar8 + 1) {
      pfVar3[lVar8 + 2] = pfVar3[lVar8 + 2] * (1.0 / (float)uVar7);
    }
    pfVar3 = pfVar3 + 3;
  }
  covar.m_rows[1].m_s[0] = covar.m_rows[0].m_s[1];
  axis.m_s[0] = 0.75;
  axis.m_s[1] = 1.25;
  vec<2U,_float>::vec(&prev_axis,&axis);
  iVar9 = 0;
  do {
    if (iVar9 == 10) break;
    dVar10 = 0.0;
    prVar4 = covar.m_rows;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      dVar11 = 0.0;
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        dVar11 = dVar11 + (double)(axis.m_s[lVar8] * ((row_vec *)prVar4->m_s)->m_s[lVar8]);
      }
      x_2.m_s[lVar6] = (float)dVar11;
      if (dVar10 <= ABS(dVar11)) {
        dVar10 = ABS(dVar11);
      }
      prVar4 = prVar4 + 1;
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      vec<2U,_float>::operator*=(&x_2,(float)(1.0 / dVar10));
    }
    operator-(&prev_axis,&x_2);
    vec<2U,_float>::operator=(&prev_axis,&axis);
    vec<2U,_float>::operator=(&axis,&x_2);
    iVar9 = iVar9 + 1;
  } while (0.0025 <= delta_axis.m_s[1] * delta_axis.m_s[1] + delta_axis.m_s[0] * delta_axis.m_s[0]);
  vec<2U,_float>::normalize(&axis,(vec<2U,_float> *)0x0);
  x_2.m_s[0] = 0.0;
  x_2.m_s[1] = 0.0;
  delta_axis.m_s[0] = 0.0;
  delta_axis.m_s[1] = 0.0;
  local_88 = 0.0;
  local_90 = 0.0;
  for (uVar7 = 0; uVar7 < (parent_node->m_vectors).m_size; uVar7 = uVar7 + 1) {
    uVar1 = (parent_node->m_vectors).m_p[uVar7];
    ppVar2 = (this->m_training_vecs).m_p;
    lhs = ppVar2 + uVar1;
    uVar1 = ppVar2[uVar1].second;
    val = (float)uVar1;
    operator-(&lhs->first,&parent_node->m_centroid);
    dVar10 = (double)uVar1;
    if (0.0 <= axis.m_s[1] * local_78.m_s[1] + axis.m_s[0] * local_78.m_s[0]) {
      operator*(&lhs->first,val);
      vec<2U,_float>::operator+=(&delta_axis,&local_78);
      local_90 = local_90 + dVar10;
    }
    else {
      operator*(&lhs->first,val);
      vec<2U,_float>::operator+=(&x_2,&local_78);
      local_88 = local_88 + dVar10;
    }
  }
  if ((local_88 <= 0.0) || (local_90 <= 0.0)) {
    compute_split_estimate(this,left_child_res,right_child_res,parent_node);
  }
  else {
    operator*(&x_2,(float)(1.0 / local_88));
    vec<2U,_float>::operator=(left_child_res,&local_78);
    operator*(&delta_axis,(float)(1.0 / local_90));
    vec<2U,_float>::operator=(right_child_res,&local_78);
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }